

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O3

void Float32_To_Int32_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float fVar1;
  float *src;
  PaInt32 *dest;
  float fVar2;
  
  if (count != 0) {
    do {
      fVar2 = PaUtil_GenerateFloatTriangularDither(ditherGenerator);
      fVar1 = *sourceBuffer;
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
      *(int *)destinationBuffer = (int)(fVar1 * 2.1474836e+09 + fVar2);
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Float32_To_Int32_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    PaInt32 *dest =  (PaInt32*)destinationBuffer;

    while( count-- )
    {
        /* REVIEW */
#ifdef PA_USE_C99_LRINTF
        float dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        float dithered = ((float)*src * (2147483646.0f)) + dither;
        *dest = lrintf(dithered - 0.5f);
#else
        double dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        double dithered = ((double)*src * (2147483646.0)) + dither;
        *dest = (PaInt32) dithered;
#endif
        src += sourceStride;
        dest += destinationStride;
    }
}